

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_inflateZstdInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  long lVar1;
  uint uVar2;
  ktx_uint32_t kVar3;
  uint uVar4;
  ZSTD_ErrorCode ZVar5;
  void *__src;
  ZSTD_DCtx *dst;
  ulong uVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar7 [16];
  ktx_size_t paddedLevelByteLength;
  ZSTD_ErrorCode error;
  size_t levelByteLength;
  int32_t level;
  ktx_size_t inflatedByteLength;
  ZSTD_DCtx *dctx;
  ktx_error_code_e result;
  ktx_uint32_t uncompressedLevelAlignment;
  ktxLevelIndexEntry *nindex;
  ktxLevelIndexEntry *cindex;
  uint64_t levelOffset;
  ktx_uint32_t levelIndexByteLength;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_88;
  size_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  size_t dstCapacity;
  long local_38;
  ktx_error_code_e local_4;
  
  uVar2 = *(int *)(in_RDI + 0x34) * 0x18;
  local_38 = 0;
  lVar1 = *(long *)(in_RDI + 0xa0);
  local_4 = KTX_SUCCESS;
  if (in_RSI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (in_RDX == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (*(int *)(in_RDI + 0x88) == 2) {
    __src = malloc((ulong)uVar2);
    if (__src == (void *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar3 = ktxTexture2_calcPostInflationLevelAlignment
                        ((ktxTexture2 *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      dstCapacity = 0;
      dst = ZSTD_createDCtx();
      if (dst == (ZSTD_DCtx *)0x0) {
        local_4 = KTX_OUT_OF_MEMORY;
      }
      else {
        in_stack_ffffffffffffff9c = *(int *)(in_RDI + 0x34);
        while (in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + -1,
              -1 < in_stack_ffffffffffffff9c) {
          in_stack_ffffffffffffff90 =
               ZSTD_decompressDCtx((ZSTD_DCtx *)CONCAT44(kVar3,local_4),dst,dstCapacity,
                                   (void *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98),
                                   in_stack_ffffffffffffff90);
          uVar4 = ZSTD_isError(0x4663ba);
          if (uVar4 != 0) {
            ZVar5 = ZSTD_getErrorCode(0x4663c9);
            if (ZVar5 == ZSTD_error_checksum_wrong) {
              local_4 = KTX_DECOMPRESS_CHECKSUM_ERROR;
            }
            else if (ZVar5 == ZSTD_error_memory_allocation) {
              local_4 = KTX_OUT_OF_MEMORY;
            }
            else if (ZVar5 == ZSTD_error_dstSize_tooSmall) {
              local_4 = KTX_DECOMPRESS_LENGTH_ERROR;
            }
            else {
              local_4 = KTX_FILE_DATA_ERROR;
            }
            goto LAB_004665a0;
          }
          if (*(ulong *)(*(long *)(in_RDI + 0xa0) + (long)in_stack_ffffffffffffff9c * 0x18 + 0x30)
              != in_stack_ffffffffffffff90) {
            local_4 = KTX_DECOMPRESS_LENGTH_ERROR;
            goto LAB_004665a0;
          }
          *(long *)((long)__src + (long)in_stack_ffffffffffffff9c * 0x18) = local_38;
          *(size_t *)((long)__src + (long)in_stack_ffffffffffffff9c * 0x18 + 8) =
               in_stack_ffffffffffffff90;
          *(size_t *)((long)__src + (long)in_stack_ffffffffffffff9c * 0x18 + 0x10) =
               in_stack_ffffffffffffff90;
          local_88 = (float)in_stack_ffffffffffffff90;
          auVar7 = ZEXT416((uint)(local_88 / (float)kVar3));
          auVar7 = roundss(auVar7,auVar7,10);
          uVar6 = (long)((float)kVar3 * auVar7._0_4_) & 0xffffffff;
          dstCapacity = uVar6 + dstCapacity;
          local_38 = uVar6 + local_38;
        }
        *(size_t *)(in_RDI + 0x68) = dstCapacity;
        *(undefined4 *)(in_RDI + 0x88) = 0;
        memcpy((void *)(lVar1 + 0x20),__src,(ulong)uVar2);
        *(ktx_uint32_t *)(*(long *)(in_RDI + 0xa0) + 8) = kVar3;
      }
LAB_004665a0:
      ZSTD_freeDCtx((ZSTD_DCtx *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      free(__src);
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZstdInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex = NULL;
    ktx_uint32_t uncompressedLevelAlignment;
    ktx_error_code_e result = KTX_SUCCESS;

    ZSTD_DCtx* dctx = NULL;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZSTD)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    dctx = ZSTD_createDCtx();
    if (dctx == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength =
            ZSTD_decompressDCtx(dctx, pInflatedData + levelOffset,
                              inflatedDataCapacity,
                              &pDeflatedData[cindex[level].byteOffset],
                              cindex[level].byteLength);
        if (ZSTD_isError(levelByteLength)) {
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLength);
            switch(error) {
              case ZSTD_error_dstSize_tooSmall:
                result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                goto cleanup;
              case ZSTD_error_checksum_wrong:
                result = KTX_DECOMPRESS_CHECKSUM_ERROR;
                goto cleanup;
              case ZSTD_error_memory_allocation:
                result =  KTX_OUT_OF_MEMORY;
                goto cleanup;
             default:
                result = KTX_FILE_DATA_ERROR;
                goto cleanup;
            }
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

cleanup:
    ZSTD_freeDCtx(dctx);
    free(nindex);
    return result;
}